

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_DH_PERSISTENT_Unmarshal(TPMI_DH_PERSISTENT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_DH_PERSISTENT *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if ((*target < 0x81000000) || (0x81ffffff < *target)) {
      target_local._4_4_ = 0x84;
    }
    else {
      target_local._4_4_ = 0;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_DH_PERSISTENT_Unmarshal(TPMI_DH_PERSISTENT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_HANDLE_Unmarshal((TPM_HANDLE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((*target < PERSISTENT_FIRST) || (*target > PERSISTENT_LAST))
    return TPM_RC_VALUE;
    return TPM_RC_SUCCESS;
}